

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  _func_void_uv__work_ptr_int **buf;
  int iVar1;
  _func_void_uv__work_ptr_int *len;
  uv__work *puVar2;
  iovec *piVar3;
  bool bVar4;
  __mode_t __mode;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uv_dirent_type_t uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint *puVar13;
  uv_loop_s *puVar14;
  uv__queue *puVar15;
  size_t sVar16;
  uv__queue *puVar17;
  ssize_t sVar18;
  size_t sVar19;
  dirent64 *dent;
  uv__queue *puVar20;
  char *pcVar21;
  ssize_t sVar22;
  long lVar23;
  uv__queue **ppuVar24;
  size_t sVar25;
  _func_void_uv__work_ptr *p_Var26;
  uv__queue *puVar27;
  pollfd pfd;
  statfs s;
  _func_void_uv__work_ptr *local_2190;
  stat64 local_2158;
  stat64 local_20c8;
  undefined1 local_2038 [24];
  uv__queue *local_2020;
  uint local_2018;
  int iStack_2014;
  uv__queue *local_2010;
  uv__queue *local_2008;
  __fsid_t local_2000;
  _func_void_uv__work_ptr *local_1ff8;
  uv_fs_type local_1ff0;
  undefined4 uStack_1fec;
  uv_fs_cb local_1fe8;
  _func_void_uv__work_ptr *p_Stack_1fe0;
  void *local_1fd8;
  uv_loop_s *puStack_1fd0;
  undefined4 local_1fc8;
  char *local_1f28;
  int local_1f20;
  int local_1f1c;
  uv_buf_t *local_1f10;
  long local_1f08;
  uv__work local_1ee0;
  size_t local_1eb0;
  
  iVar1 = *(int *)&w[-7].done;
  puVar13 = (uint *)__errno_location();
  buf = &w[-6].done;
  do {
    *puVar13 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar5 = open64((char *)w[-6].work,*(uint *)((long)&w[-2].loop + 4) | 0x80000,
                     (ulong)*(uint *)&w[-2].wq.next);
      break;
    case 2:
      iVar5 = uv__close_nocancel(*(int *)&w[-2].loop);
      if (iVar5 == -1) {
        iVar5 = -(uint)(*puVar13 != 0x73 && *puVar13 != 4);
      }
      break;
    case 3:
      iVar5 = *(int *)&w[-2].loop;
      uVar9 = *(uint *)((long)&w[-2].wq.next + 4);
      p_Var26 = w[-1].work;
      piVar3 = (iovec *)w[-2].wq.prev;
      uVar6 = uv__getiovmax();
      if (uVar9 < uVar6) {
        uVar6 = uVar9;
      }
      puVar15 = (uv__queue *)(ulong)uVar6;
      if ((long)p_Var26 < 0) {
        if (uVar6 != 0) {
          if (uVar6 == 1) {
            puVar15 = (uv__queue *)read(iVar5,piVar3->iov_base,piVar3->iov_len);
          }
          else {
            puVar15 = (uv__queue *)readv(iVar5,piVar3,uVar6);
          }
        }
      }
      else if (uVar6 != 0) {
        if (uVar6 == 1) {
          puVar15 = (uv__queue *)pread64(iVar5,piVar3->iov_base,piVar3->iov_len,(__off64_t)p_Var26);
        }
        else {
          puVar15 = (uv__queue *)preadv64(iVar5,piVar3,uVar6,(__off64_t)p_Var26);
        }
      }
      if ((w[-7].loop != (uv_loop_s *)0x0) && (puVar2 = (uv__work *)w[-2].wq.prev, puVar2 != w + 1))
      {
        uv__free(puVar2);
      }
      w[-2].wq.prev = (uv__queue *)0x0;
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      goto LAB_001110a0;
    case 4:
      uVar6 = uv__getiovmax();
      uVar9 = *(uint *)((long)&w[-2].wq.next + 4);
      puVar2 = (uv__work *)w[-2].wq.prev;
      if (uVar9 == 0) {
        puVar15 = (uv__queue *)0x0;
      }
      else {
        puVar15 = (uv__queue *)0x0;
        do {
          uVar7 = uVar6;
          if (uVar9 < uVar6) {
            uVar7 = uVar9;
          }
          *(uint *)((long)&w[-2].wq.next + 4) = uVar7;
          do {
            iVar5 = *(int *)&w[-2].loop;
            uVar7 = *(uint *)((long)&w[-2].wq.next + 4);
            puVar17 = (uv__queue *)(ulong)uVar7;
            p_Var26 = w[-1].work;
            piVar3 = (iovec *)w[-2].wq.prev;
            if ((long)p_Var26 < 0) {
              if (puVar17 != (uv__queue *)0x0) {
                if (uVar7 == 1) {
                  puVar17 = (uv__queue *)write(iVar5,piVar3->iov_base,piVar3->iov_len);
                }
                else {
                  puVar17 = (uv__queue *)writev(iVar5,piVar3,uVar7);
                }
              }
            }
            else if (puVar17 != (uv__queue *)0x0) {
              if (uVar7 == 1) {
                puVar17 = (uv__queue *)
                          pwrite64(iVar5,piVar3->iov_base,piVar3->iov_len,(__off64_t)p_Var26);
              }
              else {
                puVar17 = (uv__queue *)pwritev64(iVar5,piVar3,uVar7,(__off64_t)p_Var26);
              }
            }
          } while (((long)puVar17 < 0) && (*puVar13 == 4));
          if ((long)puVar17 < 1) {
            if (puVar15 == (uv__queue *)0x0) {
              puVar15 = puVar17;
            }
            break;
          }
          if (-1 < (long)w[-1].work) {
            w[-1].work = (_func_void_uv__work_ptr *)((long)&puVar17->next + (long)w[-1].work);
          }
          ppuVar24 = &(w[-2].wq.prev)->prev;
          uVar7 = 0;
          puVar27 = puVar17;
          do {
            puVar20 = *ppuVar24;
            if (puVar27 < puVar20) {
              ((uv__queue *)(ppuVar24 + -1))->next =
                   (uv__queue *)((long)&puVar27->next + (long)((uv__queue *)(ppuVar24 + -1))->next);
              *ppuVar24 = (uv__queue *)((long)*ppuVar24 - (long)puVar27);
              break;
            }
            uVar7 = uVar7 + 1;
            ppuVar24 = ppuVar24 + 2;
            puVar27 = (uv__queue *)((long)puVar27 - (long)puVar20);
          } while (puVar27 != (uv__queue *)0x0);
          *(uint *)((long)&w[-2].wq.next + 4) = uVar7;
          ppuVar24 = &w[-2].wq.prev;
          *ppuVar24 = *ppuVar24 + uVar7;
          puVar15 = (uv__queue *)((long)&puVar15->next + (long)puVar17);
          uVar9 = uVar9 - uVar7;
        } while (uVar9 != 0);
      }
      if (puVar2 != w + 1) {
        uv__free(puVar2);
      }
      w[-2].wq.prev = (uv__queue *)0x0;
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      goto LAB_001110a0;
    case 5:
      iVar5 = *(int *)&w[-2].loop;
      iVar12 = *(int *)((long)&w[-2].loop + 4);
      local_2158.st_dev = (__dev_t)w[-1].work;
      len = w[1].done;
      if (uv__fs_try_copy_file_range_no_copy_file_range_support != 0) goto LAB_0011051a;
      sVar22 = uv__fs_copy_file_range(iVar12,(off_t *)&local_2158,iVar5,(off_t *)0x0,(size_t)len,0);
      if (sVar22 == -1) {
        uVar9 = *puVar13;
        if ((int)uVar9 < 0x12) {
          if (uVar9 == 1) {
            iVar11 = uv__is_cifs_or_smb(iVar5);
            if (iVar11 != 0) goto LAB_0011051a;
          }
          else if ((((uVar9 == 0xd) &&
                    (iVar11 = fstatfs64(iVar12,(statfs64 *)local_2038), iVar11 != -1)) &&
                   ((uv__queue *)local_2038._0_8_ == (uv__queue *)0xc36400)) &&
                  (uVar9 = uv__kernel_version(), uVar9 < 0x41400)) {
LAB_0011051a:
            *puVar13 = 0x26;
          }
        }
        else {
          if (uVar9 == 0x12) goto LAB_0011051a;
          if (uVar9 == 0x26) {
            uv__fs_try_copy_file_range_no_copy_file_range_support = 1;
          }
          else if (uVar9 == 0x5f) goto LAB_0011051a;
        }
        if (((*puVar13 != 0x26) ||
            (sVar18 = sendfile64(iVar5,iVar12,(__off64_t *)&local_2158,(size_t)len), sVar18 == -1))
           && ((long)local_2158.st_dev <= (long)w[-1].work)) {
          uVar9 = *puVar13;
          if (((uVar9 < 0x17) && ((0x440020U >> (uVar9 & 0x1f) & 1) != 0)) ||
             (puVar15 = (uv__queue *)0xffffffffffffffff, uVar9 == 0x58)) {
            *puVar13 = 0;
            puVar17 = (uv__queue *)w[1].done;
            local_2190 = w[-1].work;
            if (puVar17 == (uv__queue *)0x0) {
              puVar15 = (uv__queue *)0x0;
            }
            else {
              iVar5 = *(int *)&w[-2].loop;
              iVar12 = *(int *)((long)&w[-2].loop + 4);
              bVar4 = true;
              puVar27 = (uv__queue *)0x0;
              do {
                while( true ) {
                  puVar15 = puVar27;
                  sVar16 = (long)puVar17 - (long)puVar15;
                  if (0x1fff < sVar16) {
                    sVar16 = 0x2000;
                  }
                  do {
                    if (bVar4) {
                      sVar19 = pread64(iVar12,local_2038,sVar16,(__off64_t)local_2190);
                    }
                    else {
                      sVar19 = read(iVar12,local_2038,sVar16);
                    }
                  } while ((sVar19 == 0xffffffffffffffff) && (*puVar13 == 4));
                  if (sVar19 == 0) goto LAB_001115c3;
                  if (sVar19 == 0xffffffffffffffff) break;
                  if (0 < (long)sVar19) {
                    lVar23 = 0;
                    sVar16 = sVar19;
LAB_00110667:
LAB_0011067a:
                    do {
                      sVar18 = write(iVar5,local_2038 + lVar23,sVar16);
                      if (sVar18 != -1) goto LAB_001106f3;
                      if (*puVar13 != 4) {
                        if (*puVar13 == 0xb) {
                          local_20c8.st_dev._4_2_ = 4;
                          local_20c8.st_dev._6_2_ = 0;
                          local_20c8.st_dev._0_4_ = iVar5;
                          while (iVar11 = poll((pollfd *)&local_20c8,1,-1), iVar11 == -1) {
                            if (*puVar13 != 4) goto LAB_001115b1;
                          }
                          if ((local_20c8.st_dev._6_2_ & 0xfffb) == 0) goto LAB_0011067a;
LAB_001115b1:
                          *puVar13 = 5;
                        }
                        puVar15 = (uv__queue *)0xffffffffffffffff;
                        goto LAB_001115c3;
                      }
                    } while( true );
                  }
LAB_0011070a:
                  local_2190 = local_2190 + sVar19;
                  puVar15 = (uv__queue *)((long)&puVar15->next + sVar19);
                  puVar27 = puVar15;
                  if (puVar17 <= puVar15) goto LAB_001115c3;
                }
                if ((!bVar4) || (puVar15 != (uv__queue *)0x0)) break;
                bVar4 = false;
                puVar27 = (uv__queue *)0x0;
              } while ((*puVar13 == 5) || (puVar27 = (uv__queue *)0x0, *puVar13 == 0x1d));
              puVar15 = (uv__queue *)((ulong)puVar15 | -(ulong)(puVar15 == (uv__queue *)0x0));
            }
LAB_001115c3:
            if (puVar15 != (uv__queue *)0xffffffffffffffff) {
              w[-1].work = local_2190;
            }
          }
          goto LAB_001110a0;
        }
      }
      puVar15 = (uv__queue *)(local_2158.st_dev + -(long)w[-1].work);
      w[-1].work = (_func_void_uv__work_ptr *)local_2158.st_dev;
      goto LAB_001110a0;
    case 6:
      p_Var26 = w[-6].work;
      iVar5 = uv__fs_statx(-1,(char *)p_Var26,0,0,(uv_stat_t *)buf);
      if (iVar5 == -0x26) {
        iVar5 = stat64((char *)p_Var26,(stat64 *)local_2038);
LAB_00110d39:
        if (iVar5 == 0) {
          w[-6].done = (_func_void_uv__work_ptr_int *)local_2038._0_8_;
          w[-6].loop = (uv_loop_s *)((ulong)local_2020 & 0xffffffff);
          w[-6].wq.next = (uv__queue *)local_2038._16_8_;
          w[-6].wq.prev = (uv__queue *)((ulong)local_2020 >> 0x20);
          w[-5].work = (_func_void_uv__work_ptr *)(ulong)local_2018;
          w[-5].done = (_func_void_uv__work_ptr_int *)local_2010;
          w[-5].loop = (uv_loop_s *)local_2038._8_8_;
          w[-5].wq.next = local_2008;
          w[-5].wq.prev = (uv__queue *)local_2000.__val;
          w[-4].work = local_1ff8;
          w[-4].wq.next = (uv__queue *)CONCAT44(uStack_1fec,local_1ff0);
          *(undefined4 *)&w[-4].wq.prev = local_1fe8._0_4_;
          w[-3].work = p_Stack_1fe0;
          *(undefined4 *)&w[-3].done = local_1fd8._0_4_;
          w[-3].loop = puStack_1fd0;
          *(undefined4 *)&w[-3].wq.next = local_1fc8;
          w[-3].wq.prev = (uv__queue *)puStack_1fd0;
          *(undefined4 *)&w[-2].work = local_1fc8;
          w[-4].done = (_func_void_uv__work_ptr_int *)0x0;
          w[-4].loop = (uv_loop_s *)0x0;
        }
      }
      break;
    case 7:
      p_Var26 = w[-6].work;
      iVar5 = uv__fs_statx(-1,(char *)p_Var26,0,1,(uv_stat_t *)buf);
      if (iVar5 == -0x26) {
        iVar5 = lstat64((char *)p_Var26,(stat64 *)local_2038);
        goto LAB_00110d39;
      }
      break;
    case 8:
      iVar5 = *(int *)&w[-2].loop;
      iVar12 = uv__fs_statx(iVar5,"",1,0,(uv_stat_t *)buf);
      if ((iVar12 == -0x26) && (iVar12 = fstat64(iVar5,(stat64 *)local_2038), iVar12 == 0)) {
        w[-6].done = (_func_void_uv__work_ptr_int *)local_2038._0_8_;
        w[-6].loop = (uv_loop_s *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq.next = (uv__queue *)local_2038._16_8_;
        w[-6].wq.prev = (uv__queue *)((ulong)local_2020 >> 0x20);
        w[-5].work = (_func_void_uv__work_ptr *)(ulong)local_2018;
        w[-5].done = (_func_void_uv__work_ptr_int *)local_2010;
        w[-5].loop = (uv_loop_s *)local_2038._8_8_;
        w[-5].wq.next = local_2008;
        w[-5].wq.prev = (uv__queue *)local_2000.__val;
        w[-4].work = local_1ff8;
        w[-4].wq.next = (uv__queue *)CONCAT44(uStack_1fec,local_1ff0);
        *(undefined4 *)&w[-4].wq.prev = local_1fe8._0_4_;
        w[-3].work = p_Stack_1fe0;
        *(undefined4 *)&w[-3].done = local_1fd8._0_4_;
        w[-3].loop = puStack_1fd0;
        *(undefined4 *)&w[-3].wq.next = local_1fc8;
        w[-3].wq.prev = (uv__queue *)puStack_1fd0;
        *(undefined4 *)&w[-2].work = local_1fc8;
        w[-4].done = (_func_void_uv__work_ptr_int *)0x0;
        w[-4].loop = (uv_loop_s *)0x0;
      }
      puVar15 = (uv__queue *)(long)iVar12;
      goto LAB_001110a0;
    case 9:
      iVar5 = ftruncate64(*(int *)&w[-2].loop,(__off64_t)w[-1].work);
      break;
    case 10:
      puVar15 = w[-1].wq.next;
      lVar23 = (long)(double)puVar15;
      puVar14 = (uv_loop_s *)
                (((long)(((double)puVar15 - (double)lVar23) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar14 >> 0x3f) + lVar23;
      local_2038._8_8_ = (uv_loop_s *)(long)((double)(long)puVar14 + 1000000000.0);
      if (-1 < (long)puVar14) {
        local_2038._8_8_ = puVar14;
      }
      puVar15 = w[-1].wq.prev;
      lVar23 = (long)(double)puVar15;
      puVar15 = (uv__queue *)
                (((long)(((double)puVar15 - (double)lVar23) * 1000000000.0) / 1000) * 1000);
      local_2038._16_8_ = ((long)puVar15 >> 0x3f) + lVar23;
      local_2020 = (uv__queue *)(long)((double)(long)puVar15 + 1000000000.0);
      if (-1 < (long)puVar15) {
        local_2020 = puVar15;
      }
      p_Var26 = w[-6].work;
      iVar5 = 0;
      goto LAB_00110823;
    case 0xb:
      puVar15 = w[-1].wq.next;
      lVar23 = (long)(double)puVar15;
      puVar14 = (uv_loop_s *)
                (((long)(((double)puVar15 - (double)lVar23) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar14 >> 0x3f) + lVar23;
      local_2038._8_8_ = (uv_loop_s *)(long)((double)(long)puVar14 + 1000000000.0);
      if (-1 < (long)puVar14) {
        local_2038._8_8_ = puVar14;
      }
      puVar15 = w[-1].wq.prev;
      lVar23 = (long)(double)puVar15;
      puVar15 = (uv__queue *)
                (((long)(((double)puVar15 - (double)lVar23) * 1000000000.0) / 1000) * 1000);
      local_2038._16_8_ = ((long)puVar15 >> 0x3f) + lVar23;
      local_2020 = (uv__queue *)(long)((double)(long)puVar15 + 1000000000.0);
      if (-1 < (long)puVar15) {
        local_2020 = puVar15;
      }
      iVar5 = futimens(*(int *)&w[-2].loop,(timespec *)local_2038);
      break;
    case 0xc:
      iVar5 = access((char *)w[-6].work,*(int *)((long)&w[-2].loop + 4));
      break;
    case 0xd:
      iVar5 = chmod((char *)w[-6].work,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0xe:
      iVar5 = fchmod(*(int *)&w[-2].loop,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0xf:
      iVar5 = fsync(*(int *)&w[-2].loop);
      break;
    case 0x10:
      iVar5 = fdatasync(*(int *)&w[-2].loop);
      break;
    case 0x11:
      iVar5 = unlink((char *)w[-6].work);
      break;
    case 0x12:
      iVar5 = rmdir((char *)w[-6].work);
      break;
    case 0x13:
      iVar5 = mkdir((char *)w[-6].work,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0x14:
      pcVar21 = mkdtemp((char *)w[-6].work);
      puVar15 = (uv__queue *)-(ulong)(pcVar21 == (char *)0x0);
      goto LAB_001110a0;
    case 0x15:
      iVar5 = rename((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x16:
      local_2038._0_8_ = (uv__queue *)0x0;
      iVar5 = scandir64((char *)w[-6].work,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      if (iVar5 == -1) {
LAB_001116a3:
        puVar15 = (uv__queue *)0xffffffffffffffff;
      }
      else {
        if (iVar5 == 0) {
          free((void *)local_2038._0_8_);
          local_2038._0_8_ = (uv__queue *)0x0;
        }
        w[-7].wq.prev = (uv__queue *)local_2038._0_8_;
LAB_00111087:
        puVar15 = (uv__queue *)(long)iVar5;
      }
      goto LAB_001110a0;
    case 0x17:
      iVar5 = link((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x18:
      iVar5 = symlink((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x19:
      sVar19 = pathconf((char *)w[-6].work,4);
      sVar16 = 0x1000;
      if (sVar19 != 0xffffffffffffffff) {
        sVar16 = sVar19;
      }
      puVar15 = (uv__queue *)uv__malloc(sVar16);
      if (puVar15 == (uv__queue *)0x0) {
        *puVar13 = 0xc;
      }
      else {
        sVar19 = readlink((char *)w[-6].work,(char *)puVar15,sVar16);
        if (sVar19 != 0xffffffffffffffff) {
          if ((sVar19 != sVar16) ||
             (puVar15 = (uv__queue *)uv__reallocf(puVar15,sVar19 + 1), puVar15 != (uv__queue *)0x0))
          {
            *(char *)((long)&puVar15->next + sVar19) = '\0';
            goto LAB_001113ab;
          }
          goto LAB_0011101c;
        }
        uv__free(puVar15);
      }
      puVar15 = (uv__queue *)0xffffffffffffffff;
      goto LAB_001110a0;
    case 0x1a:
      iVar5 = chown((char *)w[-6].work,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4));
      break;
    case 0x1b:
      iVar5 = fchown(*(int *)&w[-2].loop,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4)
                    );
      break;
    case 0x1c:
      iVar5 = lchown((char *)w[-6].work,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4))
      ;
      break;
    case 0x1d:
      puVar17 = (uv__queue *)realpath((char *)w[-6].work,(char *)0x0);
      if (puVar17 == (uv__queue *)0x0) goto LAB_0011101c;
LAB_00111010:
      w[-7].wq.prev = puVar17;
      goto LAB_001113b2;
    case 0x1e:
      iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].work,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      p_Var26 = p_Stack_1fe0;
      if (iVar5 < 0) goto LAB_00111087;
      iVar5 = (int)p_Stack_1fe0;
      iVar12 = fstat64((int)p_Stack_1fe0,&local_20c8);
      __mode = local_20c8.st_mode;
      if (iVar12 == 0) {
        iVar12 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].done,
                            (*(uint *)((long)&w[-2].loop + 4) & 1) << 7 | 0x41,local_20c8.st_mode,
                            (uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
        if (iVar12 < 0) {
          local_2190._0_4_ = -1;
        }
        else {
          local_2190._0_4_ = (int)p_Stack_1fe0;
          iVar11 = iVar12;
          if (((ulong)w[-2].loop & 0x100000000) == 0) {
            iVar10 = fstat64((int)p_Stack_1fe0,&local_2158);
            if (iVar10 == 0) {
              if ((((_func_void_uv__work_ptr *)
                    CONCAT26(local_20c8.st_dev._6_2_,
                             CONCAT24(local_20c8.st_dev._4_2_,(int)local_20c8.st_dev)) ==
                    (_func_void_uv__work_ptr *)local_2158.st_dev) &&
                  (local_20c8.st_ino == local_2158.st_ino)) ||
                 ((iVar12 = ftruncate64((int)local_2190,0), iVar12 != 0 &&
                  ((iVar12 = -*puVar13, *puVar13 != 0xd || (iVar11 = 0, 0 < local_2158.st_size))))))
              goto LAB_00111626;
              goto LAB_0011129e;
            }
LAB_0011157a:
            iVar12 = -*puVar13;
          }
          else {
LAB_0011129e:
            iVar10 = fchmod((int)local_2190,__mode);
            iVar12 = iVar11;
            if (iVar10 == -1) {
              if (*puVar13 == 1) {
                iVar11 = uv__is_cifs_or_smb((int)local_2190);
                iVar12 = 0;
                if (iVar11 != 0) goto LAB_001112b1;
                iVar12 = -1;
              }
              else {
                iVar12 = -*puVar13;
              }
            }
            else {
LAB_001112b1:
              if (((ulong)w[-2].loop & 0x600000000) != 0) {
                iVar11 = ioctl((int)local_2190,0x40049409,(ulong)p_Var26 & 0xffffffff);
                if (iVar11 == 0) goto LAB_00111626;
                if (((ulong)w[-2].loop & 0x400000000) != 0) goto LAB_0011157a;
              }
              lVar23 = 0;
              for (sVar25 = local_20c8.st_size; sVar25 != 0; sVar25 = sVar25 - (long)p_Var26) {
                local_2038._8_8_ = (uv_loop_s *)0x0;
                local_2038._16_4_ = 6;
                local_1ff0 = UV_FS_SENDFILE;
                local_1f28 = (char *)0x0;
                local_1f10 = (uv_buf_t *)0x0;
                local_1fd8 = (void *)0x0;
                puStack_1fd0 = (uv_loop_s *)0x0;
                local_1fe8 = (uv_fs_cb)0x0;
                p_Stack_1fe0 = (_func_void_uv__work_ptr *)0x0;
                local_1f1c = iVar5;
                local_1f20 = (int)local_2190;
                local_1f08 = lVar23;
                local_1eb0 = sVar25;
                uv__fs_work((uv__work *)(local_2038 + 0x158));
                p_Var26 = p_Stack_1fe0;
                uv_fs_req_cleanup((uv_fs_t *)local_2038);
                if ((long)p_Var26 < 0) {
                  iVar12 = (int)p_Var26;
                  break;
                }
                lVar23 = lVar23 + (long)p_Var26;
              }
            }
          }
        }
      }
      else {
        iVar12 = -*puVar13;
        local_2190._0_4_ = -1;
      }
LAB_00111626:
      iVar11 = 0;
      if (iVar12 < 0) {
        iVar11 = iVar12;
      }
      iVar5 = uv__close_nocheckstdio(iVar5);
      if (iVar5 == 0) {
        iVar5 = iVar11;
      }
      if (iVar12 < 0) {
        iVar5 = iVar11;
      }
      if (-1 < (int)local_2190) {
        iVar12 = uv__close_nocheckstdio((int)local_2190);
        if (iVar12 == 0) {
          iVar12 = iVar5;
        }
        if (iVar5 != 0) {
          iVar12 = iVar5;
        }
        iVar5 = 0;
        if (iVar12 != 0) {
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].done,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          iVar5 = iVar12;
        }
      }
      if (iVar5 != 0) {
        *puVar13 = -iVar5;
        goto LAB_001116a3;
      }
      puVar15 = (uv__queue *)0x0;
      goto LAB_001110a0;
    case 0x1f:
      puVar15 = (uv__queue *)uv__malloc(0x38);
      if (puVar15 != (uv__queue *)0x0) {
        puVar17 = (uv__queue *)opendir((char *)w[-6].work);
        puVar15[3].next = puVar17;
        if (puVar17 != (uv__queue *)0x0) {
LAB_001113ab:
          w[-7].wq.prev = puVar15;
          goto LAB_001113b2;
        }
      }
      uv__free(puVar15);
      w[-7].wq.prev = (uv__queue *)0x0;
LAB_0011101c:
      puVar15 = (uv__queue *)0xffffffffffffffff;
      goto LAB_001110a0;
    case 0x20:
      puVar15 = w[-7].wq.prev;
      if (puVar15->prev == (uv__queue *)0x0) {
        uVar9 = 0;
      }
      else {
        puVar17 = (uv__queue *)0x0;
LAB_00110b82:
        do {
          *puVar13 = 0;
          dent = readdir64((DIR *)puVar15[3].next);
          uVar9 = (uint)puVar17;
          if (dent == (dirent64 *)0x0) {
            if (*puVar13 != 0) {
LAB_00111175:
              if (uVar9 != 0) {
                lVar23 = 0;
                do {
                  uv__free(*(void **)((long)&puVar15->next->next + lVar23));
                  *(undefined8 *)((long)&puVar15->next->next + lVar23) = 0;
                  lVar23 = lVar23 + 0x10;
                } while ((long)puVar17 << 4 != lVar23);
              }
              uVar9 = 0xffffffff;
            }
            break;
          }
          pcVar21 = dent->d_name;
          iVar5 = strcmp(pcVar21,".");
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar21,".."), iVar5 == 0)) {
            if (puVar15->prev <= puVar17) break;
            goto LAB_00110b82;
          }
          puVar27 = puVar15->next;
          puVar20 = (uv__queue *)uv__strdup(pcVar21);
          puVar27[(long)puVar17].next = puVar20;
          if (puVar20 == (uv__queue *)0x0) goto LAB_00111175;
          uVar8 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
          *(uv_dirent_type_t *)&puVar27[(long)puVar17].prev = uVar8;
          uVar9 = uVar9 + 1;
          puVar17 = (uv__queue *)(ulong)uVar9;
        } while (puVar17 < puVar15->prev);
      }
      puVar15 = (uv__queue *)(long)(int)uVar9;
      goto LAB_001110a0;
    case 0x21:
      puVar15 = w[-7].wq.prev;
      puVar17 = puVar15[3].next;
      if (puVar17 != (uv__queue *)0x0) {
        closedir((DIR *)puVar17);
        puVar15[3].next = (uv__queue *)0x0;
      }
      uv__free(w[-7].wq.prev);
      w[-7].wq.prev = (uv__queue *)0x0;
LAB_001113b2:
      puVar15 = (uv__queue *)0x0;
      goto LAB_001110a0;
    case 0x22:
      iVar5 = statfs64((char *)w[-6].work,(statfs64 *)local_2038);
      puVar15 = (uv__queue *)0xffffffffffffffff;
      if (iVar5 == 0) {
        puVar17 = (uv__queue *)uv__malloc(0x58);
        if (puVar17 != (uv__queue *)0x0) {
          puVar17->next = (uv__queue *)local_2038._0_8_;
          puVar17->prev = (uv__queue *)local_2038._8_8_;
          puVar17[1].next = (uv__queue *)local_2038._16_8_;
          puVar17[1].prev = local_2020;
          puVar17[2].next = (uv__queue *)CONCAT44(iStack_2014,local_2018);
          puVar17[2].prev = local_2010;
          puVar17[3].next = local_2008;
          goto LAB_00111010;
        }
        *puVar13 = 0xc;
      }
      goto LAB_001110a0;
    case 0x23:
      p_Var26 = w[-6].work;
      sVar16 = strlen((char *)p_Var26);
      if ((sVar16 < 6) || (iVar5 = strcmp((char *)(p_Var26 + (sVar16 - 6)),"XXXXXX"), iVar5 != 0)) {
        *puVar13 = 0x16;
        iVar5 = -1;
LAB_00110427:
        if (iVar5 < 0) {
          *p_Var26 = (_func_void_uv__work_ptr)0x0;
        }
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp == (_func_int_char_ptr_int *)0x0 || uv__fs_mkstemp_no_cloexec_support != 0)
        {
LAB_00111414:
          if (w[-7].loop != (uv_loop_s *)0x0) {
            uv_rwlock_rdlock((uv_rwlock_t *)(w[-9].wq.next + 0x13));
          }
          iVar5 = mkstemp64((char *)p_Var26);
          if ((-1 < iVar5) && (iVar12 = uv__cloexec(iVar5,1), iVar12 != 0)) {
            iVar12 = uv__close(iVar5);
            iVar5 = -1;
            if (iVar12 != 0) {
switchD_001102c2_default:
              abort();
            }
          }
          if (w[-7].loop != (uv_loop_s *)0x0) {
            uv_rwlock_rdunlock((uv_rwlock_t *)(w[-9].wq.next + 0x13));
          }
          goto LAB_00110427;
        }
        iVar5 = (*uv__mkostemp)((char *)p_Var26,0x80000);
        if (iVar5 < 0) {
          if (*puVar13 != 0x16) goto LAB_00110427;
          uv__fs_mkstemp_no_cloexec_support = 1;
          goto LAB_00111414;
        }
      }
      puVar15 = (uv__queue *)(long)iVar5;
      goto LAB_001110a0;
    case 0x24:
      puVar15 = w[-1].wq.next;
      lVar23 = (long)(double)puVar15;
      puVar14 = (uv_loop_s *)
                (((long)(((double)puVar15 - (double)lVar23) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar14 >> 0x3f) + lVar23;
      local_2038._8_8_ = (uv_loop_s *)(long)((double)(long)puVar14 + 1000000000.0);
      if (-1 < (long)puVar14) {
        local_2038._8_8_ = puVar14;
      }
      puVar15 = w[-1].wq.prev;
      lVar23 = (long)(double)puVar15;
      puVar15 = (uv__queue *)
                (((long)(((double)puVar15 - (double)lVar23) * 1000000000.0) / 1000) * 1000);
      local_2038._16_8_ = ((long)puVar15 >> 0x3f) + lVar23;
      local_2020 = (uv__queue *)(long)((double)(long)puVar15 + 1000000000.0);
      if (-1 < (long)puVar15) {
        local_2020 = puVar15;
      }
      p_Var26 = w[-6].work;
      iVar5 = 0x100;
LAB_00110823:
      iVar5 = utimensat(-100,(char *)p_Var26,(timespec *)local_2038,iVar5);
      break;
    default:
      goto switchD_001102c2_default;
    }
    puVar15 = (uv__queue *)(long)iVar5;
LAB_001110a0:
    puVar17 = puVar15;
    if (puVar15 != (uv__queue *)0xffffffffffffffff) goto LAB_001116c2;
  } while ((iVar1 - 4U < 0xfffffffe) && (*puVar13 == 4));
  puVar17 = (uv__queue *)-(long)(int)*puVar13;
LAB_001116c2:
  w[-7].wq.next = puVar17;
  if ((puVar15 == (uv__queue *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-7].wq.prev = (uv__queue *)buf;
  }
  return;
LAB_001106f3:
  lVar23 = lVar23 + sVar18;
  sVar16 = sVar19 - lVar23;
  if (sVar16 == 0 || (long)sVar19 < lVar23) goto LAB_0011070a;
  goto LAB_00110667;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}